

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl_test.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImplTest_ValidInput_DecodeNetDiagData_Test::TestBody
          (CommissionerImplTest_ValidInput_DecodeNetDiagData_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  AssertHelper local_598;
  Message local_590;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_21;
  Message local_570;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_20;
  Message local_550;
  int local_544;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_19;
  Message local_528;
  int local_51c;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_18;
  Message local_500;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar_17;
  Message local_4e0;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_16;
  Message local_4c0;
  int local_4b4;
  undefined1 local_4b0 [8];
  AssertionResult gtest_ar_15;
  Message local_498;
  int local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_14;
  Message local_470;
  int local_464;
  size_type local_460;
  undefined1 local_458 [8];
  AssertionResult gtest_ar_13;
  Message local_440;
  int local_434;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_12;
  Message local_418;
  int local_40c;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_11;
  Message local_3f0;
  int local_3e4;
  size_type local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_10;
  Message local_3c0;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_9;
  Message local_3a0;
  int local_394;
  size_type local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_8;
  Message local_370;
  int local_364;
  size_type local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  bool local_331;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  Message local_318;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_5;
  Message local_2f8;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_4;
  Message local_2d8;
  int local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_3;
  Message local_2b0;
  ErrorCode local_2a4;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_2;
  string local_288;
  Error local_268;
  unsigned_short local_23a;
  undefined1 local_238 [6];
  uint16_t macAddr;
  ByteArray extMacAddrBytes;
  Message local_218;
  ErrorCode local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1d0;
  Message local_1c8;
  ErrorCode local_1bc;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  allocator local_179;
  undefined1 local_178 [8];
  string tlvsHexString;
  undefined1 local_148 [8];
  Error error;
  NetDiagData diagData;
  ByteArray buf;
  CommissionerImplTest_ValidInput_DecodeNetDiagData_Test *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&diagData.mPresentFlags);
  NetDiagData::NetDiagData((NetDiagData *)((long)&error.mMessage.field_2 + 8));
  Error::Error((Error *)local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_178,
             "00086ac6c2de12b212df0102c80002010f0512e7000400204300300af1f1f1f1f101f1f1f10608360bb9f7415c30210840fd9238a3395d0001f9043dfeb7b3edf3fd7d604fb88a0000000000fffe00c800fd7d604fb88a0000fe3e5a4c31acb559fe8000000000000068c6c2de12b212df1009601804601d046019041e22c818fdc31ff45feff4e7e580431c60becfabfd110022000000008df846f3ab0c05551e22c802fdc31ff45feff4e75257420f1cbd46f5fd1100220000000034e5d9e28d1952c0"
             ,&local_179);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  utils::Hex((Error *)&gtest_ar.message_,(ByteArray *)&diagData.mPresentFlags,(string *)local_178);
  Error::operator=((Error *)local_148,(Error *)&gtest_ar.message_);
  Error::~Error((Error *)&gtest_ar.message_);
  local_1bc = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1b8,"error","ErrorCode::kNone",(Error *)local_148,&local_1bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  internal::DecodeNetDiagData
            ((Error *)&gtest_ar_1.message_,(NetDiagData *)((long)&error.mMessage.field_2 + 8),
             (ByteArray *)&diagData.mPresentFlags);
  Error::operator=((Error *)local_148,(Error *)&gtest_ar_1.message_);
  Error::~Error((Error *)&gtest_ar_1.message_);
  local_20c = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_208,"error","ErrorCode::kNone",(Error *)local_148,&local_20c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &extMacAddrBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xa3,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &extMacAddrBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_218);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &extMacAddrBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
  local_23a = 0xc800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_288,"6ac6c2de12b212df",
             (allocator *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  utils::Hex(&local_268,(ByteArray *)local_238,&local_288);
  Error::operator=((Error *)local_148,&local_268);
  Error::~Error(&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_2a4 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::Error,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_2a0,"error","ErrorCode::kNone",(Error *)local_148,&local_2a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  local_2cc = 0x27f;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2c8,"diagData.mPresentFlags","639",
             (unsigned_long *)
             &diagData.mChildIpv6AddrsInfoList.
              super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xaa,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  testing::internal::EqHelper::
  Compare<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((EqHelper *)local_2f0,"diagData.mExtMacAddr","extMacAddrBytes",
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xab,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((EqHelper *)local_310,"diagData.mMacAddr","macAddr",
             (unsigned_short *)
             &diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_23a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_331 = false;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_330,"diagData.mMode.mIsMtd","false",
             (bool *)(error.mMessage.field_2._M_local_buf + 9),&local_331);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_340);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  local_360 = std::
              vector<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
              ::size((vector<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
                      *)&diagData.mRoute64.mMask.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  local_364 = 9;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_358,"diagData.mRoute64.mRouteData.size()","9",&local_360,&local_364);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xae,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  local_390 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&diagData.mMacCounters.mIfOutDiscards);
  local_394 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_388,"diagData.mAddrs.size()","4",&local_390,&local_394);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&diagData.mMacCounters.mIfOutDiscards,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[37],_nullptr>
            ((EqHelper *)local_3b8,"diagData.mAddrs[0]","\"fd92:38a3:395d:1:f904:3dfe:b7b3:edf3\"",
             pvVar3,(char (*) [37])"fd92:38a3:395d:1:f904:3dfe:b7b3:edf3");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  local_3e0 = std::
              vector<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
              ::size((vector<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                      *)&diagData.mAddrs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_3e4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3d8,"diagData.mChildTable.size()","3",&local_3e0,&local_3e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  pvVar4 = std::
           vector<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
           ::operator[]((vector<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                         *)&diagData.mAddrs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_40c = 0x18;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_408,"diagData.mChildTable[0].mChildId","24",&pvVar4->mChildId,
             &local_40c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  local_434 = 0x21;
  testing::internal::EqHelper::Compare<unsigned_char,_int,_nullptr>
            ((EqHelper *)local_430,"diagData.mLeaderData.mRouterId","33",
             (uchar *)((long)&diagData.mRoute64.mRouteData.
                              super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&local_434);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_440);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  local_460 = std::
              vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
              ::size((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                      *)&diagData.mChildTable.
                         super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_464 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_458,"diagData.mChildIpv6AddrsInfoList.size()","2",&local_460,
             &local_464);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_458);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_458);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_458);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_48c = 0xc818;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_488,"diagData.mChildIpv6AddrsInfoList[0].mRloc16","51224",
             &pvVar5->mRloc16,&local_48c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_498);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  local_4b4 = 0x18;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_4b0,"diagData.mChildIpv6AddrsInfoList[0].mChildId","24",
             &pvVar5->mChildId,&local_4b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b0);
  if (!bVar1) {
    testing::Message::Message(&local_4c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_4c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b0);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&pvVar5->mAddrs,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[40],_nullptr>
            ((EqHelper *)local_4d8,"diagData.mChildIpv6AddrsInfoList[0].mAddrs[0]",
             "\"fdc3:1ff4:5fef:f4e7:e580:431c:60be:cfab\"",pvVar3,
             (char (*) [40])"fdc3:1ff4:5fef:f4e7:e580:431c:60be:cfab");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&pvVar5->mAddrs,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[28],_nullptr>
            ((EqHelper *)local_4f8,"diagData.mChildIpv6AddrsInfoList[0].mAddrs[1]",
             "\"fd11:22::8df8:46f3:ab0c:555\"",pvVar3,(char (*) [28])"fd11:22::8df8:46f3:ab0c:555");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  local_51c = 0xc802;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_518,"diagData.mChildIpv6AddrsInfoList[1].mRloc16","51202",
             &pvVar5->mRloc16,&local_51c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xb9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_528);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_528);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  local_544 = 2;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_540,"diagData.mChildIpv6AddrsInfoList[1].mChildId","2",
             &pvVar5->mChildId,&local_544);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&pvVar5->mAddrs,0);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[40],_nullptr>
            ((EqHelper *)local_568,"diagData.mChildIpv6AddrsInfoList[1].mAddrs[0]",
             "\"fdc3:1ff4:5fef:f4e7:5257:420f:1cbd:46f5\"",pvVar3,
             (char (*) [40])"fdc3:1ff4:5fef:f4e7:5257:420f:1cbd:46f5");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_570);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_570);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  pvVar5 = std::
           vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
           ::operator[]((vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                         *)&diagData.mChildTable.
                            super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&pvVar5->mAddrs,1);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[29],_nullptr>
            ((EqHelper *)local_588,"diagData.mChildIpv6AddrsInfoList[1].mAddrs[1]",
             "\"fd11:22::34e5:d9e2:8d19:52c0\"",pvVar3,(char (*) [29])"fd11:22::34e5:d9e2:8d19:52c0"
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_588);
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl_test.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_238);
  std::__cxx11::string::~string((string *)local_178);
  Error::~Error((Error *)local_148);
  NetDiagData::~NetDiagData((NetDiagData *)((long)&error.mMessage.field_2 + 8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&diagData.mPresentFlags);
  return;
}

Assistant:

TEST(CommissionerImplTest, ValidInput_DecodeNetDiagData)
{
    ByteArray   buf;
    NetDiagData diagData;
    Error       error;
    std::string tlvsHexString =
        "00086ac6c2de12b212df0102c80002010f0512e7000400204300300af1f1f1f1f101f1f1f10608360bb9f7415c30210840fd9238a3395d"
        "0001f9043dfeb7b3edf3fd7d604fb88a0000000000fffe00c800fd7d604fb88a0000fe3e5a4c31acb559fe8000000000000068c6c2de12"
        "b212df1009601804601d046019041e22c818fdc31ff45feff4e7e580431c60becfabfd110022000000008df846f3ab0c05551e22c802fd"
        "c31ff45feff4e75257420f1cbd46f5fd1100220000000034e5d9e28d1952c0";

    error = utils::Hex(buf, tlvsHexString);
    EXPECT_EQ(error, ErrorCode::kNone);

    error = ot::commissioner::internal::DecodeNetDiagData(diagData, buf);
    EXPECT_EQ(error, ErrorCode::kNone);

    ByteArray extMacAddrBytes;
    uint16_t  macAddr = 0xc800;
    error             = utils::Hex(extMacAddrBytes, "6ac6c2de12b212df");

    EXPECT_EQ(error, ErrorCode::kNone);
    EXPECT_EQ(diagData.mPresentFlags, 639);
    EXPECT_EQ(diagData.mExtMacAddr, extMacAddrBytes);
    EXPECT_EQ(diagData.mMacAddr, macAddr);
    EXPECT_EQ(diagData.mMode.mIsMtd, false);
    EXPECT_EQ(diagData.mRoute64.mRouteData.size(), 9);
    EXPECT_EQ(diagData.mAddrs.size(), 4);
    EXPECT_EQ(diagData.mAddrs[0], "fd92:38a3:395d:1:f904:3dfe:b7b3:edf3");
    EXPECT_EQ(diagData.mChildTable.size(), 3);
    EXPECT_EQ(diagData.mChildTable[0].mChildId, 24);
    EXPECT_EQ(diagData.mLeaderData.mRouterId, 33);
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList.size(), 2);
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[0].mRloc16, 51224);
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[0].mChildId, 24);
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[0].mAddrs[0], "fdc3:1ff4:5fef:f4e7:e580:431c:60be:cfab");
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[0].mAddrs[1], "fd11:22::8df8:46f3:ab0c:555");
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[1].mRloc16, 51202);
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[1].mChildId, 2);
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[1].mAddrs[0], "fdc3:1ff4:5fef:f4e7:5257:420f:1cbd:46f5");
    EXPECT_EQ(diagData.mChildIpv6AddrsInfoList[1].mAddrs[1], "fd11:22::34e5:d9e2:8d19:52c0");
}